

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O0

Abc_Cex_t *
Bmc_ChainFailOneOutput(Gia_Man_t *p,int nFrameMax,int nConfMax,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Saig_ParBmc_t *pPars;
  Saig_ParBmc_t Pars;
  Aig_Man_t *pAig;
  Abc_Cex_t *pCex;
  int RetValue;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nConfMax_local;
  int nFrameMax_local;
  Gia_Man_t *p_local;
  
  pAig = (Aig_Man_t *)0x0;
  Pars.pFuncStop = (_func_int_int *)Gia_ManToAigSimple(p);
  Saig_ParBmcSetDefaultParams((Saig_ParBmc_t *)&pPars);
  pPars._4_4_ = nFrameMax;
  Pars.nStart = nConfMax;
  Pars.nLearnedDelta = fVeryVerbose;
  iVar1 = Saig_ManBmcScalable((Aig_Man_t *)Pars.pFuncStop,(Saig_ParBmc_t *)&pPars);
  if (iVar1 == 0) {
    pAig = *(Aig_Man_t **)(Pars.pFuncStop + 0x198);
    *(undefined8 *)(Pars.pFuncStop + 0x198) = 0;
    if (fVeryVerbose != 0) {
      Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.\n",
                (ulong)*(uint *)&pAig->pName,p->pName,(ulong)*(uint *)((long)&pAig->pName + 4));
    }
  }
  else if (fVeryVerbose != 0) {
    Abc_Print(1,"No output asserted in %d frames. Resource limit reached.\n",
              (ulong)(Pars.pLogFileName._4_4_ + 2));
  }
  Aig_ManStop((Aig_Man_t *)Pars.pFuncStop);
  return (Abc_Cex_t *)pAig;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the first failure.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Bmc_ChainFailOneOutput( Gia_Man_t * p, int nFrameMax, int nConfMax, int fVerbose, int fVeryVerbose )
{
    int RetValue;
    Abc_Cex_t * pCex = NULL;
    Aig_Man_t * pAig = Gia_ManToAigSimple( p );
    Saig_ParBmc_t Pars, * pPars = &Pars;
    Saig_ParBmcSetDefaultParams( pPars );
    pPars->nFramesMax = nFrameMax;
    pPars->nConfLimit = nConfMax;
    pPars->fVerbose   = fVeryVerbose;
    RetValue = Saig_ManBmcScalable( pAig, pPars );
    if ( RetValue == 0 ) // SAT
    {
        pCex = pAig->pSeqModel, pAig->pSeqModel = NULL;
        if ( fVeryVerbose )
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", pCex->iPo, p->pName, pCex->iFrame );
    }
    else if ( fVeryVerbose )
        Abc_Print( 1, "No output asserted in %d frames. Resource limit reached.\n", pPars->iFrame+2 );
    Aig_ManStop( pAig );
    return pCex;
}